

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<EnumDef>::emplace<EnumDef_const&>
          (QMovableArrayOps<EnumDef> *this,qsizetype i,EnumDef *args)

{
  EnumDef **ppEVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_c0;
  EnumDef tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size == i) {
      qVar5 = QArrayDataPointer<EnumDef>::freeSpaceAtEnd((QArrayDataPointer<EnumDef> *)this);
      if (qVar5 == 0) goto LAB_0010f17d;
      EnumDef::EnumDef((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr
                       + (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.
                         size,args);
LAB_0010f28c:
      pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0010f245;
    }
LAB_0010f17d:
    if (i == 0) {
      qVar5 = QArrayDataPointer<EnumDef>::freeSpaceAtBegin((QArrayDataPointer<EnumDef> *)this);
      if (qVar5 != 0) {
        EnumDef::EnumDef((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.
                         ptr + -1,args);
        ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
        *ppEVar1 = *ppEVar1 + -1;
        goto LAB_0010f28c;
      }
    }
  }
  tmp.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
  super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
       (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)0xaaaaaaaa;
  tmp._100_4_ = 0xaaaaaaaa;
  tmp.values.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  tmp.values.d.size = -0x5555555555555556;
  tmp.type.d.size = -0x5555555555555556;
  tmp.values.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.type.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  tmp.enumName.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  tmp.enumName.d.size = -0x5555555555555556;
  tmp.name.d.size = -0x5555555555555556;
  tmp.enumName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  EnumDef::EnumDef(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size != 0;
  QArrayDataPointer<EnumDef>::detachAndGrow
            ((QArrayDataPointer<EnumDef> *)this,(uint)(i == 0 && bVar6),1,(EnumDef **)0x0,
             (QArrayDataPointer<EnumDef> *)0x0);
  if (i == 0 && bVar6) {
    EnumDef::EnumDef((this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr +
                     -1,&tmp);
    ppEVar1 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.ptr;
    *ppEVar1 = *ppEVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<EnumDef>).super_QArrayDataPointer<EnumDef>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_c0,(QArrayDataPointer<EnumDef> *)this,i,1);
    EnumDef::EnumDef(local_c0.displaceFrom,&tmp);
    local_c0.displaceFrom = local_c0.displaceFrom + 1;
    (local_c0.data)->size = (local_c0.data)->size + local_c0.nInserts;
  }
  EnumDef::~EnumDef(&tmp);
LAB_0010f245:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }